

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O0

StridedValueAccess<64> __thiscall
rsg::StridedValueAccess<64>::member(StridedValueAccess<64> *this,int memberNdx)

{
  Scalar *pSVar1;
  int iVar2;
  VariableType *pVVar3;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this_00;
  const_reference this_01;
  VariableType *this_02;
  int memberNdx_local;
  StridedValueAccess<64> *this_local;
  
  pVVar3 = ConstStridedValueAccess<64>::getType(&this->super_ConstStridedValueAccess<64>);
  this_00 = VariableType::getMembers(pVVar3);
  this_01 = std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::
            operator[](this_00,(long)memberNdx);
  pVVar3 = VariableType::Member::getType(this_01);
  pSVar1 = (this->super_ConstStridedValueAccess<64>).m_value;
  this_02 = ConstStridedValueAccess<64>::getType(&this->super_ConstStridedValueAccess<64>);
  iVar2 = VariableType::getMemberScalarOffset(this_02,memberNdx);
  StridedValueAccess((StridedValueAccess<64> *)&this_local,pVVar3,pSVar1 + (iVar2 << 6));
  return (StridedValueAccess<64>)_this_local;
}

Assistant:

StridedValueAccess			member				(int memberNdx)		{ return StridedValueAccess(this->getType().getMembers()[memberNdx].getType(), this->m_value + Stride*this->getType().getMemberScalarOffset(memberNdx));	}